

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

uint32_t lzma_mf_find(lzma_mf *mf,uint32_t *count_ptr,lzma_match *matches)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint local_7c;
  uint8_t *p2;
  uint8_t *p1;
  uint32_t limit;
  uint32_t i;
  uint32_t len_best;
  uint32_t count;
  lzma_match *matches_local;
  uint32_t *count_ptr_local;
  lzma_mf *mf_local;
  uint64_t x;
  uint local_c;
  
  uVar2 = (*mf->find)(mf,matches);
  limit = 0;
  if (uVar2 != 0) {
    for (p1._4_4_ = 0; p1._4_4_ < uVar2; p1._4_4_ = p1._4_4_ + 1) {
      if (mf->nice_len < matches[p1._4_4_].len) {
        __assert_fail("matches[i].len <= mf->nice_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x26,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      if (mf->read_pos <= matches[p1._4_4_].dist) {
        __assert_fail("matches[i].dist < mf->read_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x27,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      puVar5 = mf_ptr(mf);
      puVar6 = mf_ptr(mf);
      iVar3 = memcmp(puVar5 + -1,puVar6 + (-2 - (ulong)matches[p1._4_4_].dist),
                     (ulong)matches[p1._4_4_].len);
      if (iVar3 != 0) {
        __assert_fail("memcmp(mf_ptr(mf) - 1, mf_ptr(mf) - matches[i].dist - 2, matches[i].len) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2a,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
    }
    limit = matches[uVar2 - 1].len;
    if (limit == mf->nice_len) {
      uVar4 = mf_avail(mf);
      p1._0_4_ = uVar4 + 1;
      if (mf->match_len_max < (uint32_t)p1) {
        p1._0_4_ = mf->match_len_max;
      }
      puVar5 = mf_ptr(mf);
      uVar1 = matches[uVar2 - 1].dist;
      if ((uint32_t)p1 < limit) {
        __assert_fail("len <= limit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2e,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      x._4_4_ = limit;
      if (0x7fffffff < (uint32_t)p1) {
        __assert_fail("limit <= UINT32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2f,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
LAB_00237337:
      if (x._4_4_ < (uint32_t)p1) {
        uVar7 = read64ne(puVar5 + ((ulong)x._4_4_ - 1));
        uVar8 = read64ne(puVar5 + (ulong)x._4_4_ + (-2 - (ulong)uVar1));
        uVar9 = uVar7 - uVar8;
        if (uVar9 == 0) goto LAB_002373a6;
        uVar1 = 0;
        for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
          uVar1 = uVar1 + 1;
        }
        local_7c = (uVar1 >> 3) + x._4_4_;
        if ((uint32_t)p1 <= local_7c) {
          local_7c = (uint32_t)p1;
        }
        local_c = local_7c;
      }
      else {
        local_c = (uint32_t)p1;
      }
      limit = local_c;
    }
  }
  *count_ptr = uVar2;
  mf->read_ahead = mf->read_ahead + 1;
  return limit;
LAB_002373a6:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_00237337;
}

Assistant:

extern uint32_t
lzma_mf_find(lzma_mf *mf, uint32_t *count_ptr, lzma_match *matches)
{
	// Call the match finder. It returns the number of length-distance
	// pairs found.
	// FIXME: Minimum count is zero, what _exactly_ is the maximum?
	const uint32_t count = mf->find(mf, matches);

	// Length of the longest match; assume that no matches were found
	// and thus the maximum length is zero.
	uint32_t len_best = 0;

	if (count > 0) {
#ifndef NDEBUG
		// Validate the matches.
		for (uint32_t i = 0; i < count; ++i) {
			assert(matches[i].len <= mf->nice_len);
			assert(matches[i].dist < mf->read_pos);
			assert(memcmp(mf_ptr(mf) - 1,
				mf_ptr(mf) - matches[i].dist - 2,
				matches[i].len) == 0);
		}
#endif

		// The last used element in the array contains
		// the longest match.
		len_best = matches[count - 1].len;

		// If a match of maximum search length was found, try to
		// extend the match to maximum possible length.
		if (len_best == mf->nice_len) {
			// The limit for the match length is either the
			// maximum match length supported by the LZ-based
			// encoder or the number of bytes left in the
			// dictionary, whichever is smaller.
			uint32_t limit = mf_avail(mf) + 1;
			if (limit > mf->match_len_max)
				limit = mf->match_len_max;

			// Pointer to the byte we just ran through
			// the match finder.
			const uint8_t *p1 = mf_ptr(mf) - 1;

			// Pointer to the beginning of the match. We need -1
			// here because the match distances are zero based.
			const uint8_t *p2 = p1 - matches[count - 1].dist - 1;

			len_best = lzma_memcmplen(p1, p2, len_best, limit);
		}
	}

	*count_ptr = count;

	// Finally update the read position to indicate that match finder was
	// run for this dictionary offset.
	++mf->read_ahead;

	return len_best;
}